

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O0

void __thiscall ipx::LpSolver::MakeIPMStartingPointValid(LpSolver *this)

{
  bool bVar1;
  Int IVar2;
  Int IVar3;
  Vector *this_00;
  Vector *this_01;
  valarray<double> *this_02;
  double *pdVar4;
  valarray<double> *this_03;
  valarray<double> *this_04;
  valarray<double> *this_05;
  long in_RDI;
  double dVar5;
  Int j_1;
  double mu;
  Int j;
  double sumComplementarityProducts;
  Int numComplementarityProducts;
  Vector *zu;
  Vector *zl;
  Vector *xu;
  Vector *xl;
  Vector *ub;
  Vector *lb;
  Int n;
  Int m;
  double local_88;
  int local_64;
  int local_54;
  double local_50;
  int local_44;
  
  IVar2 = Model::rows((Model *)(in_RDI + 0x7a8));
  IVar3 = Model::cols((Model *)(in_RDI + 0x7a8));
  this_00 = Model::lb((Model *)(in_RDI + 0x7a8));
  this_01 = Model::ub((Model *)(in_RDI + 0x7a8));
  this_03 = (valarray<double> *)(in_RDI + 0xae0);
  this_04 = (valarray<double> *)(in_RDI + 0xaf0);
  this_05 = (valarray<double> *)(in_RDI + 0xb10);
  this_02 = (valarray<double> *)(in_RDI + 0xb20);
  local_44 = 0;
  local_50 = 0.0;
  for (local_54 = 0; local_54 < IVar3 + IVar2; local_54 = local_54 + 1) {
    pdVar4 = std::valarray<double>::operator[](this_03,(long)local_54);
    if ((0.0 < *pdVar4) &&
       (pdVar4 = std::valarray<double>::operator[](this_05,(long)local_54), 0.0 < *pdVar4)) {
      pdVar4 = std::valarray<double>::operator[](this_03,(long)local_54);
      dVar5 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](this_05,(long)local_54);
      local_50 = dVar5 * *pdVar4 + local_50;
      local_44 = local_44 + 1;
    }
    pdVar4 = std::valarray<double>::operator[](this_04,(long)local_54);
    if ((0.0 < *pdVar4) &&
       (pdVar4 = std::valarray<double>::operator[](this_02,(long)local_54), 0.0 < *pdVar4)) {
      pdVar4 = std::valarray<double>::operator[](this_04,(long)local_54);
      dVar5 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](this_02,(long)local_54);
      local_50 = dVar5 * *pdVar4 + local_50;
      local_44 = local_44 + 1;
    }
  }
  if (local_44 == 0) {
    local_88 = 1.0;
  }
  else {
    local_88 = local_50 / (double)local_44;
  }
  local_64 = 0;
  do {
    if (IVar3 + IVar2 <= local_64) {
      return;
    }
    pdVar4 = std::valarray<double>::operator[](this_00,(long)local_64);
    bVar1 = std::isfinite(*pdVar4);
    if (bVar1) {
      pdVar4 = std::valarray<double>::operator[](this_03,(long)local_64);
      if ((*pdVar4 == 0.0) && (!NAN(*pdVar4))) {
        pdVar4 = std::valarray<double>::operator[](this_05,(long)local_64);
        if ((*pdVar4 == 0.0) && (!NAN(*pdVar4))) {
          dVar5 = sqrt(local_88);
          pdVar4 = std::valarray<double>::operator[](this_05,(long)local_64);
          *pdVar4 = dVar5;
          pdVar4 = std::valarray<double>::operator[](this_03,(long)local_64);
          *pdVar4 = dVar5;
          goto LAB_008364f8;
        }
      }
      pdVar4 = std::valarray<double>::operator[](this_03,(long)local_64);
      if ((*pdVar4 != 0.0) || (NAN(*pdVar4))) {
        pdVar4 = std::valarray<double>::operator[](this_05,(long)local_64);
        if ((*pdVar4 == 0.0) && (!NAN(*pdVar4))) {
          pdVar4 = std::valarray<double>::operator[](this_03,(long)local_64);
          dVar5 = *pdVar4;
          pdVar4 = std::valarray<double>::operator[](this_05,(long)local_64);
          *pdVar4 = local_88 / dVar5;
        }
      }
      else {
        pdVar4 = std::valarray<double>::operator[](this_05,(long)local_64);
        dVar5 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](this_03,(long)local_64);
        *pdVar4 = local_88 / dVar5;
      }
    }
LAB_008364f8:
    pdVar4 = std::valarray<double>::operator[](this_01,(long)local_64);
    bVar1 = std::isfinite(*pdVar4);
    if (bVar1) {
      pdVar4 = std::valarray<double>::operator[](this_04,(long)local_64);
      if ((*pdVar4 == 0.0) && (!NAN(*pdVar4))) {
        pdVar4 = std::valarray<double>::operator[](this_02,(long)local_64);
        if ((*pdVar4 == 0.0) && (!NAN(*pdVar4))) {
          dVar5 = sqrt(local_88);
          pdVar4 = std::valarray<double>::operator[](this_02,(long)local_64);
          *pdVar4 = dVar5;
          pdVar4 = std::valarray<double>::operator[](this_04,(long)local_64);
          *pdVar4 = dVar5;
          goto LAB_0083668c;
        }
      }
      pdVar4 = std::valarray<double>::operator[](this_04,(long)local_64);
      if ((*pdVar4 != 0.0) || (NAN(*pdVar4))) {
        pdVar4 = std::valarray<double>::operator[](this_02,(long)local_64);
        if ((*pdVar4 == 0.0) && (!NAN(*pdVar4))) {
          pdVar4 = std::valarray<double>::operator[](this_04,(long)local_64);
          dVar5 = *pdVar4;
          pdVar4 = std::valarray<double>::operator[](this_02,(long)local_64);
          *pdVar4 = local_88 / dVar5;
        }
      }
      else {
        pdVar4 = std::valarray<double>::operator[](this_02,(long)local_64);
        dVar5 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](this_04,(long)local_64);
        *pdVar4 = local_88 / dVar5;
      }
    }
LAB_0083668c:
    local_64 = local_64 + 1;
  } while( true );
}

Assistant:

void LpSolver::MakeIPMStartingPointValid() {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    Vector& xl = xl_start_;
    Vector& xu = xu_start_;
    Vector& zl = zl_start_;
    Vector& zu = zu_start_;

    Int numComplementarityProducts = 0;
    double sumComplementarityProducts = 0.0;
    for (Int j = 0; j < n+m; ++j) {
        if (xl[j] > 0.0 && zl[j] > 0.0) {
            sumComplementarityProducts += xl[j] * zl[j];
            numComplementarityProducts++;
        }
        if (xu[j] > 0.0 && zu[j] > 0.0) {
            sumComplementarityProducts += xu[j] * zu[j];
            numComplementarityProducts++;
        }
    }
    const double mu = numComplementarityProducts ?
        sumComplementarityProducts / numComplementarityProducts : 1.0;

    for (Int j = 0; j < n+m; ++j) {
        if (std::isfinite(lb[j])) {
            assert(std::isfinite(xl[j]) && xl[j] >= 0.0);
            assert(std::isfinite(zl[j]) && zl[j] >= 0.0);
            if (xl[j] == 0.0 && zl[j] == 0.0)
                xl[j] = zl[j] = std::sqrt(mu);
            else if (xl[j] == 0.0)
                xl[j] = mu / zl[j];
            else if (zl[j] == 0.0)
                zl[j] = mu / xl[j];
        } else {
            assert(xl[j] == INFINITY);
            assert(zl[j] == 0.0);
        }
        if (std::isfinite(ub[j])) {
            assert(std::isfinite(xu[j]) && xu[j] >= 0.0);
            assert(std::isfinite(zu[j]) && zu[j] >= 0.0);
            if (xu[j] == 0.0 && zu[j] == 0.0)
                xu[j] = zu[j] = std::sqrt(mu);
            else if (xu[j] == 0.0)
                xu[j] = mu / zu[j];
            else if (zu[j] == 0.0)
                zu[j] = mu / xu[j];
        } else {
            assert(xu[j] == INFINITY);
            assert(zu[j] == 0.0);
        }
    }
}